

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

u32string * LiteScript::String::ConvertToUnicode(u32string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  uint uVar2;
  pointer pcVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  char32_t __c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  uVar2 = (uint)str->_M_string_length;
  uVar6 = 0;
  do {
    uVar5 = (uint)uVar6;
    if (uVar2 <= uVar5) {
      return __return_storage_ptr__;
    }
    pcVar3 = (str->_M_dataplus)._M_p;
    bVar1 = pcVar3[uVar6];
    __c = (char32_t)bVar1;
    if ((char)bVar1 < '\0') {
      if ((bVar1 >> 4 & 2) == 0) {
        if (uVar2 - 1 <= uVar5) {
          return __return_storage_ptr__;
        }
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back(__return_storage_ptr__,(byte)pcVar3[uVar6 + 1] & 0x3f | (__c & 0x1fU) << 6);
        uVar5 = uVar5 + 1;
      }
      else if ((bVar1 >> 4 & 1) == 0) {
        if (uVar2 - 2 <= uVar5) {
          return __return_storage_ptr__;
        }
        uVar5 = uVar5 + 2;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back(__return_storage_ptr__,
                    (byte)pcVar3[uVar5] & 0x3f |
                    ((byte)pcVar3[uVar6 + 1] & 0x3f) << 6 | (__c & 0xfU) << 0xc);
      }
      else {
        if (uVar2 - 3 <= uVar5) {
          return __return_storage_ptr__;
        }
        uVar4 = uVar5 + 2;
        uVar5 = uVar5 + 3;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back(__return_storage_ptr__,
                    (byte)pcVar3[uVar5] & 0x3f |
                    ((byte)pcVar3[uVar4] & 0x3f) << 6 |
                    ((byte)pcVar3[uVar6 + 1] & 0x3f) << 0xc | (__c & 7U) << 0x12);
      }
    }
    else {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(__return_storage_ptr__,__c);
    }
    uVar6 = (ulong)(uVar5 + 1);
  } while( true );
}

Assistant:

std::u32string LiteScript::String::ConvertToUnicode(const std::string& str) {
    std::u32string res;
    for (unsigned int i = 0, sz = str.size(); i < sz; i++) {
        std::bitset<4> header(((unsigned char)str[i] & (unsigned char)0b11110000) >> 4);
        if (header[3] == 0) {
            //1 byte
            res.push_back((unsigned char)str[i]);
        }
        else if (header[1] == 0) {
            //2 bytes
            if (i >= sz - 1) return res;
            res.push_back(((char32_t) ((unsigned char) str[i] & 0b00011111) << 6) |
                          (char32_t) ((unsigned char) str[i + 1] & 0b00111111));
            i += 1;
        }
        else if (header[0] == 0) {
            //3 bytes
            if (i >= sz - 2) return res;
            res.push_back(((char32_t) ((unsigned char) str[i] & 0b00001111) << 12) |
                          ((char32_t) ((unsigned char) str[i + 1] & 0b00111111) << 6) |
                          (char32_t) ((unsigned char) str[i + 2] & 0b00111111));
            i += 2;
        }
        else {
            //4 bytes
            if (i >= sz - 3) return res;
            res.push_back(((char32_t) ((unsigned char) str[i] & 0b00000111) << 18) |
                          ((char32_t) ((unsigned char) str[i + 1] & 0b00111111) << 12) |
                          ((char32_t) ((unsigned char) str[i + 2] & 0b00111111) << 6) |
                          (char32_t) ((unsigned char) str[i + 3] & 0b00111111));
            i += 3;
        }
    }
    return res;
}